

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall QPDFWriter::writeHeader(QPDFWriter *this)

{
  element_type *peVar1;
  char *pcVar2;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  size_t sStack_10;
  
  str._M_str = "%PDF-";
  str._M_len = 5;
  writeString(this,str);
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  str_00._M_str = (peVar1->final_pdf_version)._M_dataplus._M_p;
  str_00._M_len = (peVar1->final_pdf_version)._M_string_length;
  writeString(this,str_00);
  if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pclm
      == true) {
    pcVar2 = "\n%PCLm 1.0\n";
    sStack_10 = 0xb;
  }
  else {
    pcVar2 = anon_var_dwarf_556a6e;
    sStack_10 = 7;
  }
  str_01._M_str = pcVar2;
  str_01._M_len = sStack_10;
  writeString(this,str_01);
  str_02._M_str = "%QDF-1.0\n\n";
  str_02._M_len = 10;
  writeStringQDF(this,str_02);
  return;
}

Assistant:

void
QPDFWriter::writeHeader()
{
    writeString("%PDF-");
    writeString(m->final_pdf_version);
    if (m->pclm) {
        // PCLm version
        writeString("\n%PCLm 1.0\n");
    } else {
        // This string of binary characters would not be valid UTF-8, so it really should be treated
        // as binary.
        writeString("\n%\xbf\xf7\xa2\xfe\n");
    }
    writeStringQDF("%QDF-1.0\n\n");

    // Note: do not write extra header text here.  Linearized PDFs must include the entire
    // linearization parameter dictionary within the first 1024 characters of the PDF file, so for
    // linearized files, we have to write extra header text after the linearization parameter
    // dictionary.
}